

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

subindex * __thiscall merlin::subindex::operator++(subindex *this)

{
  ulong local_18;
  size_t i;
  subindex *this_local;
  
  local_18 = 0;
  while( true ) {
    if (this->m_nd <= local_18) {
      return this;
    }
    if (this->m_state[local_18] != this->m_dims[local_18]) break;
    this->m_state[local_18] = 1;
    if ((this->m_skipped[local_18] & 1U) == 0) {
      this->m_idx = this->m_idx - this->m_subtract[local_18];
    }
    local_18 = local_18 + 1;
  }
  this->m_state[local_18] = this->m_state[local_18] + 1;
  if ((this->m_skipped[local_18] & 1U) != 0) {
    return this;
  }
  this->m_idx = this->m_add[local_18] + this->m_idx;
  return this;
}

Assistant:

subindex& operator++(void) {
		for (size_t i = 0; i < m_nd; ++i) { // for each variable
			if (m_state[i] == m_dims[i]) { // if we reached the maximum, wrap around to 1
				m_state[i] = 1;          // subtract wrap value from position
				if (!m_skipped[i])
					m_idx -= m_subtract[i]; // and continue to next variable in sequence
			} else {                    // otherwise, increment variable index
				++m_state[i];             // add to our current position
				if (!m_skipped[i])
					m_idx += m_add[i];   // and break (leave later vars the same)
				break;
			}
		}
		return *this;
	}